

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::writeMPS
          (SPxLPBase<double> *this,ostream *p_output,NameSet *p_rnames,NameSet *p_cnames,
          DIdxSet *p_intvars,bool writeZeroObjective)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  SPxSense SVar5;
  Verbosity VVar6;
  ostream *poVar7;
  double *pdVar8;
  undefined8 uVar9;
  element_type *this_00;
  int __c;
  int __c_00;
  int __c_01;
  SPxLPBase<double> *in_RSI;
  SPxLPBase<double> *in_RDI;
  IdxSet *in_R8;
  byte in_R9B;
  bool bVar10;
  Verbosity old_verbosity;
  double rhsval2;
  double rhsval1;
  int colsize2;
  SVectorBase<double> *col;
  bool is_intvar;
  bool is_intrun;
  int j;
  bool has_intvars;
  int k;
  int i;
  bool has_ranges;
  char name2 [16];
  char name1 [16];
  char name [16];
  char *indicator;
  SPxLPBase<double> *in_stack_fffffffffffffd38;
  SPxLPBase<double> *in_stack_fffffffffffffd40;
  NameSet *in_stack_fffffffffffffd48;
  SPxLPBase<double> *in_stack_fffffffffffffd50;
  SPxLPBase<double> *in_stack_fffffffffffffd58;
  double in_stack_fffffffffffffd98;
  double in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  uint uVar11;
  char *in_stack_fffffffffffffdb8;
  SPxLPBase<double> *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  char *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  uint in_stack_fffffffffffffde4;
  byte local_1ba;
  bool local_151;
  bool local_14a;
  bool local_149;
  undefined4 local_f0;
  Verbosity local_ec;
  double local_e8;
  double local_e0;
  int local_c4;
  SVectorBase<double> *local_c0;
  bool local_b6;
  bool local_b5;
  int local_b4;
  bool local_ae;
  undefined1 local_ad;
  allocator local_99;
  string local_98 [36];
  uint local_74;
  uint local_70;
  byte local_69;
  char *local_38;
  byte local_29;
  IdxSet *local_28;
  SPxLPBase<double> *local_10;
  
  local_29 = in_R9B & 1;
  local_69 = 0;
  local_28 = in_R8;
  local_10 = in_RSI;
  SPxOut::setScientific
            ((ostream *)in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
  poVar7 = std::operator<<((ostream *)local_10,"NAME          MPSDATA");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)local_10,"ROWS");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  for (local_70 = 0; uVar11 = local_70, iVar3 = nRows((SPxLPBase<double> *)0x2063e1),
      (int)uVar11 < iVar3; local_70 = local_70 + 1) {
    pdVar8 = lhs(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
    dVar1 = *pdVar8;
    pdVar8 = rhs(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
    if ((dVar1 != *pdVar8) || (NAN(dVar1) || NAN(*pdVar8))) {
      pdVar8 = lhs(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
      dVar1 = *pdVar8;
      pdVar8 = (double *)infinity();
      if (-*pdVar8 < dVar1) {
        pdVar8 = rhs(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
        dVar1 = *pdVar8;
        pdVar8 = (double *)infinity();
        if (dVar1 < *pdVar8) {
          local_38 = "E";
          local_69 = 1;
          goto LAB_00206696;
        }
      }
      pdVar8 = lhs(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
      dVar1 = *pdVar8;
      pdVar8 = (double *)infinity();
      if (dVar1 <= -*pdVar8) {
        pdVar8 = rhs(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
        dVar1 = *pdVar8;
        pdVar8 = (double *)infinity();
        if (*pdVar8 <= dVar1) {
          local_ad = 1;
          uVar9 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_98,"XMPSWR02 This should never happen.",&local_99);
          SPxInternalCodeException::SPxInternalCodeException
                    ((SPxInternalCodeException *)in_stack_fffffffffffffd40,
                     (string *)in_stack_fffffffffffffd38);
          local_ad = 0;
          __cxa_throw(uVar9,&SPxInternalCodeException::typeinfo,
                      SPxInternalCodeException::~SPxInternalCodeException);
        }
        local_38 = "L";
      }
      else {
        local_38 = "G";
      }
    }
    else {
      local_38 = "E";
    }
LAB_00206696:
    MPSgetRowName<double>
              (in_stack_fffffffffffffd58,(int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
               in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40);
    MPSwriteRecord<double>
              ((ostream *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
               (double)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (double)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  }
  MPSwriteRecord<double>
            ((ostream *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
             (double)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (double)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  poVar7 = std::operator<<((ostream *)local_10,"COLUMNS");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  local_149 = false;
  if (local_28 != (IdxSet *)0x0) {
    iVar3 = IdxSet::size(local_28);
    local_149 = 0 < iVar3;
  }
  local_ae = local_149;
  local_b4 = 0;
  while( true ) {
    iVar3 = 1;
    if ((local_ae & 1U) != 0) {
      iVar3 = 2;
    }
    if (iVar3 <= local_b4) break;
    bVar10 = (local_ae & 1U) != 0;
    local_14a = bVar10 && local_b4 == 1;
    local_b5 = local_14a;
    if (bVar10 && local_b4 == 1) {
      poVar7 = std::operator<<((ostream *)local_10,
                               "    MARK0001  \'MARKER\'                 \'INTORG\'");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    for (local_70 = 0; uVar11 = local_70, iVar3 = nCols((SPxLPBase<double> *)0x20685b),
        (int)uVar11 < iVar3; local_70 = local_70 + 1) {
      local_151 = false;
      if ((local_ae & 1U) != 0) {
        iVar3 = IdxSet::pos((IdxSet *)in_stack_fffffffffffffd48,
                            (int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
        local_151 = -1 < iVar3;
      }
      local_b6 = local_151;
      if ((((local_b5 & 1U) == 0) || (local_151 != false)) &&
         (((local_b5 & 1U) != 0 || (local_151 == false)))) {
        local_c0 = colVector(in_stack_fffffffffffffd40,
                             (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
        iVar3 = SVectorBase<double>::size(local_c0);
        local_c4 = iVar3 / 2 << 1;
        for (local_74 = 0; iVar3 = local_c4, (int)local_74 < local_c4; local_74 = local_74 + 2) {
          getColName<double>(in_stack_fffffffffffffd58,
                             (int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                             in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40);
          SVectorBase<double>::index(local_c0,(char *)(ulong)local_74,__c);
          MPSgetRowName<double>
                    (in_stack_fffffffffffffd58,(int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                     in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40);
          SVectorBase<double>::value(local_c0,local_74);
          SVectorBase<double>::index(local_c0,(char *)(ulong)(local_74 + 1),__c_00);
          MPSgetRowName<double>
                    (in_stack_fffffffffffffd58,(int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                     in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40);
          SVectorBase<double>::value(local_c0,local_74 + 1);
          MPSwriteRecord<double>
                    ((ostream *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                     (double)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                     (double)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
        }
        iVar4 = SVectorBase<double>::size(local_c0);
        if (iVar3 != iVar4) {
          getColName<double>(in_stack_fffffffffffffd58,
                             (int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                             in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40);
          SVectorBase<double>::index(local_c0,(char *)(ulong)local_74,__c_01);
          MPSgetRowName<double>
                    (in_stack_fffffffffffffd58,(int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                     in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40);
          SVectorBase<double>::value(local_c0,local_74);
          MPSwriteRecord<double>
                    ((ostream *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                     (double)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                     (double)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
        }
        maxObj(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
        tolerances(in_stack_fffffffffffffd38);
        this_00 = std::
                  __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x206b9d);
        Tolerances::epsilon(this_00);
        bVar10 = isNotZero<double,double>
                           ((double)in_stack_fffffffffffffd40,(double)in_stack_fffffffffffffd38);
        local_1ba = 1;
        if (!bVar10) {
          local_1ba = local_29;
        }
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x206c10)
        ;
        if ((local_1ba & 1) != 0) {
          getColName<double>(in_stack_fffffffffffffd58,
                             (int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                             in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40);
          maxObj(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
          MPSwriteRecord<double>
                    ((ostream *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                     (double)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                     (double)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
        }
      }
    }
    if ((local_b5 & 1U) != 0) {
      poVar7 = std::operator<<((ostream *)local_10,
                               "    MARK0001  \'MARKER\'                 \'INTEND\'");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    local_b4 = local_b4 + 1;
  }
  poVar7 = std::operator<<((ostream *)local_10,"RHS");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  local_70 = 0;
  while (uVar11 = local_70, iVar3 = nRows((SPxLPBase<double> *)0x206d80), (int)uVar11 < iVar3) {
    local_e0 = 0.0;
    local_e8 = 0.0;
    for (; uVar11 = local_70, iVar3 = nRows((SPxLPBase<double> *)0x206dc4), (int)uVar11 < iVar3;
        local_70 = local_70 + 1) {
      lhs(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
      rhs(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
      local_e0 = MPSgetRHS<double>(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      if ((local_e0 != 0.0) || (NAN(local_e0))) break;
    }
    uVar2 = local_70;
    iVar3 = nRows((SPxLPBase<double> *)0x206e63);
    uVar11 = local_70;
    if ((int)uVar2 < iVar3) {
      while( true ) {
        local_74 = uVar11 + 1;
        uVar11 = local_74;
        iVar3 = nRows((SPxLPBase<double> *)0x206ea0);
        if (iVar3 <= (int)uVar11) break;
        lhs(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
        rhs(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
        local_e8 = MPSgetRHS<double>(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        if ((local_e8 != 0.0) || (uVar11 = local_74, NAN(local_e8))) break;
      }
      uVar11 = local_74;
      iVar3 = nRows((SPxLPBase<double> *)0x206f3f);
      iVar4 = (int)((ulong)in_stack_fffffffffffffd50 >> 0x20);
      if ((int)uVar11 < iVar3) {
        MPSgetRowName<double>
                  (in_stack_fffffffffffffd58,iVar4,in_stack_fffffffffffffd48,
                   (char *)in_stack_fffffffffffffd40);
        MPSgetRowName<double>
                  (in_stack_fffffffffffffd58,(int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                   in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40);
        MPSwriteRecord<double>
                  ((ostream *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                   (double)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                   (double)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
      }
      else {
        MPSgetRowName<double>
                  (in_stack_fffffffffffffd58,iVar4,in_stack_fffffffffffffd48,
                   (char *)in_stack_fffffffffffffd40);
        MPSwriteRecord<double>
                  ((ostream *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                   (double)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                   (double)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
      }
      local_70 = local_74 + 1;
    }
  }
  if ((local_69 & 1) != 0) {
    poVar7 = std::operator<<((ostream *)local_10,"RANGES");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    local_70 = 0;
    while (in_stack_fffffffffffffde4 = local_70, iVar3 = nRows((SPxLPBase<double> *)0x2070c5),
          (int)in_stack_fffffffffffffde4 < iVar3) {
      pdVar8 = lhs(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
      in_stack_fffffffffffffdd8 = (char *)*pdVar8;
      pdVar8 = (double *)infinity();
      if (-*pdVar8 < (double)in_stack_fffffffffffffdd8) {
        pdVar8 = rhs(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
        in_stack_fffffffffffffdd0 = (char *)*pdVar8;
        pdVar8 = (double *)infinity();
        if ((double)in_stack_fffffffffffffdd0 < *pdVar8) {
          in_stack_fffffffffffffdc0 = local_10;
          in_stack_fffffffffffffdc8 =
               MPSgetRowName<double>
                         (in_stack_fffffffffffffd58,(int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                          in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40);
          pdVar8 = rhs(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
          in_stack_fffffffffffffdb8 = (char *)*pdVar8;
          lhs(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
          MPSwriteRecord<double>
                    ((ostream *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                     (double)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                     (double)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
        }
      }
      local_70 = local_70 + 1;
    }
  }
  poVar7 = std::operator<<((ostream *)local_10,"BOUNDS");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  local_70 = 0;
  do {
    uVar11 = local_70;
    iVar3 = nCols((SPxLPBase<double> *)0x207270);
    if (iVar3 <= (int)uVar11) {
      poVar7 = std::operator<<((ostream *)local_10,"ENDATA");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      SVar5 = spxSense(in_RDI);
      if (((SVar5 == MAXIMIZE) && (in_RDI->spxout != (SPxOut *)0x0)) &&
         (VVar6 = SPxOut::getVerbosity(in_RDI->spxout), 0 < (int)VVar6)) {
        local_ec = SPxOut::getVerbosity(in_RDI->spxout);
        local_f0 = 1;
        (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_f0);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38);
        (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_ec);
      }
      return;
    }
    pdVar8 = lower(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
    dVar1 = *pdVar8;
    pdVar8 = upper(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
    if ((dVar1 != *pdVar8) || (NAN(dVar1) || NAN(*pdVar8))) {
      pdVar8 = lower(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
      dVar1 = *pdVar8;
      pdVar8 = (double *)infinity();
      if (dVar1 <= -*pdVar8) {
        pdVar8 = upper(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
        dVar1 = *pdVar8;
        pdVar8 = (double *)infinity();
        if (*pdVar8 <= dVar1) {
          getColName<double>(in_stack_fffffffffffffd58,
                             (int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                             in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40);
          MPSwriteRecord<double>
                    ((ostream *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                     (double)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                     (double)CONCAT44(uVar11,in_stack_fffffffffffffdb0));
          goto LAB_00207696;
        }
      }
      pdVar8 = lower(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
      if ((*pdVar8 != 0.0) || (NAN(*pdVar8))) {
        pdVar8 = lower(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
        dVar1 = *pdVar8;
        pdVar8 = (double *)infinity();
        iVar3 = (int)((ulong)in_stack_fffffffffffffd50 >> 0x20);
        if (dVar1 <= -*pdVar8) {
          getColName<double>(in_stack_fffffffffffffd58,iVar3,in_stack_fffffffffffffd48,
                             (char *)in_stack_fffffffffffffd40);
          MPSwriteRecord<double>
                    ((ostream *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                     (double)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                     (double)CONCAT44(uVar11,in_stack_fffffffffffffdb0));
        }
        else {
          getColName<double>(in_stack_fffffffffffffd58,iVar3,in_stack_fffffffffffffd48,
                             (char *)in_stack_fffffffffffffd40);
          lower(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
          MPSwriteRecord<double>
                    ((ostream *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                     (double)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                     (double)CONCAT44(uVar11,in_stack_fffffffffffffdb0));
        }
      }
      if (((local_ae & 1U) == 0) ||
         (iVar3 = IdxSet::pos((IdxSet *)in_stack_fffffffffffffd48,
                              (int)((ulong)in_stack_fffffffffffffd40 >> 0x20)), iVar3 < 0)) {
        pdVar8 = upper(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
        in_stack_fffffffffffffd48 = (NameSet *)*pdVar8;
        pdVar8 = (double *)infinity();
        if ((double)in_stack_fffffffffffffd48 < *pdVar8) {
          in_stack_fffffffffffffd38 = local_10;
          in_stack_fffffffffffffd40 =
               (SPxLPBase<double> *)
               getColName<double>(in_stack_fffffffffffffd58,
                                  (int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                                  in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40);
          upper(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
          MPSwriteRecord<double>
                    ((ostream *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                     in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                     (double)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                     (double)CONCAT44(uVar11,in_stack_fffffffffffffdb0));
        }
      }
      else {
        in_stack_fffffffffffffd50 = local_10;
        in_stack_fffffffffffffd58 =
             (SPxLPBase<double> *)
             getColName<double>(in_stack_fffffffffffffd58,(int)((ulong)local_10 >> 0x20),
                                in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40);
        upper(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
        MPSwriteRecord<double>
                  ((ostream *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                   (double)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                   (double)CONCAT44(uVar11,in_stack_fffffffffffffdb0));
      }
    }
    else {
      getColName<double>(in_stack_fffffffffffffd58,(int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                         in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40);
      lower(in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
      MPSwriteRecord<double>
                ((ostream *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                 (double)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                 (double)CONCAT44(uVar11,in_stack_fffffffffffffdb0));
    }
LAB_00207696:
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

inline
void SPxLPBase<R>::writeMPS(
   std::ostream&  p_output,          ///< output stream.
   const NameSet* p_rnames,          ///< row names.
   const NameSet* p_cnames,          ///< column names.
   const DIdxSet* p_intvars,         ///< integer variables.
   const bool     writeZeroObjective ///< write zero objective coefficients
) const
{

   const char*    indicator;
   char           name [16];
   char           name1[16];
   char           name2[16];
   bool           has_ranges = false;
   int            i;
   int            k;

   SPxOut::setScientific(p_output, 16);
   // --- NAME Section ---
   p_output << "NAME          MPSDATA" << std::endl;

   // --- ROWS Section ---
   p_output << "ROWS" << std::endl;

   for(i = 0; i < nRows(); i++)
   {
      if(lhs(i) == rhs(i))
         indicator = "E";
      else if((lhs(i) > R(-infinity)) && (rhs(i) < R(infinity)))
      {
         indicator = "E";
         has_ranges = true;
      }
      else if(lhs(i) > R(-infinity))
         indicator = "G";
      else if(rhs(i) <  R(infinity))
         indicator = "L";
      else
         throw SPxInternalCodeException("XMPSWR02 This should never happen.");

      MPSwriteRecord<R>(p_output, indicator, MPSgetRowName(*this, i, p_rnames, name));
   }

   MPSwriteRecord<R>(p_output, "N", "MINIMIZE");

   // --- COLUMNS Section ---
   p_output << "COLUMNS" << std::endl;

   bool has_intvars = (p_intvars != nullptr) && (p_intvars->size() > 0);

   for(int j = 0; j < (has_intvars ? 2 : 1); j++)
   {
      bool is_intrun = has_intvars && (j == 1);

      if(is_intrun)
         p_output << "    MARK0001  'MARKER'                 'INTORG'" << std::endl;

      for(i = 0; i < nCols(); i++)
      {
         bool is_intvar = has_intvars && (p_intvars->pos(i) >= 0);

         if((is_intrun && !is_intvar) || (!is_intrun &&  is_intvar))
            continue;

         const SVectorBase<R>& col = colVector(i);
         int colsize2 = (col.size() / 2) * 2;

         assert(colsize2 % 2 == 0);

         for(k = 0; k < colsize2; k += 2)
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name),
                           MPSgetRowName(*this, col.index(k), p_rnames, name1), col.value(k),
                           MPSgetRowName(*this, col.index(k + 1), p_rnames, name2), col.value(k + 1));

         if(colsize2 != col.size())
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name),
                           MPSgetRowName(*this, col.index(k), p_rnames, name1), col.value(k));

         if(isNotZero(maxObj(i), this->tolerances()->epsilon()) || writeZeroObjective)
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name), "MINIMIZE", -maxObj(i));
      }

      if(is_intrun)
         p_output << "    MARK0001  'MARKER'                 'INTEND'" << std::endl;
   }

   // --- RHS Section ---
   p_output << "RHS" << std::endl;

   i = 0;

   while(i < nRows())
   {
      R rhsval1 = 0.0;
      R rhsval2 = 0.0;

      for(; i < nRows(); i++)
         if((rhsval1 = MPSgetRHS(lhs(i), rhs(i))) != 0.0)
            break;

      if(i < nRows())
      {
         for(k = i + 1; k < nRows(); k++)
         {
            if((rhsval2 = MPSgetRHS(lhs(k), rhs(k))) != 0.0)
               break;
         }

         if(k < nRows())
         {
            MPSwriteRecord(p_output, nullptr, "RHS", MPSgetRowName(*this, i, p_rnames, name1), rhsval1,
                           MPSgetRowName(*this, k, p_rnames, name2), rhsval2);
         }
         else
            MPSwriteRecord(p_output, nullptr, "RHS", MPSgetRowName(*this, i, p_rnames, name1), rhsval1);

         i = k + 1;
      }
   }

   // --- RANGES Section ---
   if(has_ranges)
   {
      p_output << "RANGES" << std::endl;

      for(i = 0; i < nRows(); i++)
      {
         if((lhs(i) > R(-infinity)) && (rhs(i) < R(infinity)))
            MPSwriteRecord(p_output, "", "RANGE", MPSgetRowName(*this, i, p_rnames, name1), rhs(i) - lhs(i));
      }
   }

   // --- BOUNDS Section ---
   p_output << "BOUNDS" << std::endl;

   for(i = 0; i < nCols(); i++)
   {
      if(lower(i) == upper(i))
      {
         MPSwriteRecord(p_output, "FX", "BOUND", getColName(*this, i, p_cnames, name1), lower(i));
         continue;
      }

      if((lower(i) <= R(-infinity)) && (upper(i) >= R(infinity)))
      {
         MPSwriteRecord<R>(p_output, "FR", "BOUND", getColName(*this, i, p_cnames, name1));
         continue;
      }

      if(lower(i) != 0.0)
      {
         if(lower(i) > R(-infinity))
            MPSwriteRecord(p_output, "LO", "BOUND", getColName(*this, i, p_cnames, name1), lower(i));
         else
            MPSwriteRecord<R>(p_output, "MI", "BOUND", getColName(*this, i, p_cnames, name1));
      }

      if(has_intvars && (p_intvars->pos(i) >= 0))
      {
         // Integer variables have default upper bound 1.0, but we should write
         // it nevertheless since CPLEX seems to assume R(infinity) otherwise.
         MPSwriteRecord(p_output, "UP", "BOUND", getColName(*this, i, p_cnames, name1), upper(i));
      }
      else
      {
         // Continous variables have default upper bound R(infinity)
         if(upper(i) < R(infinity))
            MPSwriteRecord(p_output, "UP", "BOUND", getColName(*this, i, p_cnames, name1), upper(i));
      }
   }

   // --- ENDATA Section ---
   p_output << "ENDATA" << std::endl;

   // Output warning when writing a maximisation problem
   if(spxSense() == SPxLPBase<R>::MAXIMIZE)
   {
      SPX_MSG_WARNING((*spxout), (*spxout) <<
                      "XMPSWR03 Warning: objective function inverted when writing maximization problem in MPS file format\n");
   }
}